

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall asl::Array<asl::InetAddress>::free(Array<asl::InetAddress> *this,void *__ptr)

{
  asl_destroy<asl::InetAddress>(this->_a,*(int *)&this->_a[-1]._data._a);
  ::free(this->_a + -1);
  this->_a = (InetAddress *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}